

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePresetsGraph.cxx
# Opt level: O3

char * cmCMakePresetsGraph::ResultToString(ReadFileResult result)

{
  if (result < 0x20) {
    return &DAT_006cf0a8 + *(int *)(&DAT_006cf0a8 + (ulong)result * 4);
  }
  return "Unknown error";
}

Assistant:

const char* cmCMakePresetsGraph::ResultToString(ReadFileResult result)
{
  switch (result) {
    case ReadFileResult::READ_OK:
      return "OK";
    case ReadFileResult::FILE_NOT_FOUND:
      return "File not found";
    case ReadFileResult::JSON_PARSE_ERROR:
      return "JSON parse error";
    case ReadFileResult::INVALID_ROOT:
      return "Invalid root object";
    case ReadFileResult::NO_VERSION:
      return "No \"version\" field";
    case ReadFileResult::INVALID_VERSION:
      return "Invalid \"version\" field";
    case ReadFileResult::UNRECOGNIZED_VERSION:
      return "Unrecognized \"version\" field";
    case ReadFileResult::INVALID_CMAKE_VERSION:
      return "Invalid \"cmakeMinimumRequired\" field";
    case ReadFileResult::UNRECOGNIZED_CMAKE_VERSION:
      return "\"cmakeMinimumRequired\" version too new";
    case ReadFileResult::INVALID_PRESETS:
      return "Invalid \"configurePresets\" field";
    case ReadFileResult::INVALID_PRESET:
      return "Invalid preset";
    case ReadFileResult::INVALID_VARIABLE:
      return "Invalid CMake variable definition";
    case ReadFileResult::DUPLICATE_PRESETS:
      return "Duplicate presets";
    case ReadFileResult::CYCLIC_PRESET_INHERITANCE:
      return "Cyclic preset inheritance";
    case ReadFileResult::INHERITED_PRESET_UNREACHABLE_FROM_FILE:
      return "Inherited preset is unreachable from preset's file";
    case ReadFileResult::CONFIGURE_PRESET_UNREACHABLE_FROM_FILE:
      return "Configure preset is unreachable from preset's file";
    case ReadFileResult::INVALID_MACRO_EXPANSION:
      return "Invalid macro expansion";
    case ReadFileResult::BUILD_TEST_PRESETS_UNSUPPORTED:
      return "File version must be 2 or higher for build and test preset "
             "support.";
    case ReadFileResult::PACKAGE_PRESETS_UNSUPPORTED:
      return "File version must be 6 or higher for package preset support";
    case ReadFileResult::WORKFLOW_PRESETS_UNSUPPORTED:
      return "File version must be 6 or higher for workflow preset support";
    case ReadFileResult::INCLUDE_UNSUPPORTED:
      return "File version must be 4 or higher for include support";
    case ReadFileResult::INVALID_INCLUDE:
      return "Invalid \"include\" field";
    case ReadFileResult::INVALID_CONFIGURE_PRESET:
      return "Invalid \"configurePreset\" field";
    case ReadFileResult::INSTALL_PREFIX_UNSUPPORTED:
      return "File version must be 3 or higher for installDir preset "
             "support.";
    case ReadFileResult::INVALID_CONDITION:
      return "Invalid preset condition";
    case ReadFileResult::CONDITION_UNSUPPORTED:
      return "File version must be 3 or higher for condition support";
    case ReadFileResult::TOOLCHAIN_FILE_UNSUPPORTED:
      return "File version must be 3 or higher for toolchainFile preset "
             "support.";
    case ReadFileResult::CYCLIC_INCLUDE:
      return "Cyclic include among preset files";
    case ReadFileResult::TEST_OUTPUT_TRUNCATION_UNSUPPORTED:
      return "File version must be 5 or higher for testOutputTruncation "
             "preset support.";
    case ReadFileResult::INVALID_WORKFLOW_STEPS:
      return "Invalid workflow steps";
    case ReadFileResult::WORKFLOW_STEP_UNREACHABLE_FROM_FILE:
      return "Workflow step is unreachable from preset's file";
    case ReadFileResult::CTEST_JUNIT_UNSUPPORTED:
      return "File version must be 6 or higher for CTest JUnit output support";
  }

  return "Unknown error";
}